

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternSelection.cpp
# Opt level: O0

Iterator * __thiscall
PatternSelection::iterator(Iterator *__return_storage_ptr__,PatternSelection *this)

{
  PatternAnchor end_00;
  PatternAnchor start_00;
  undefined8 local_28;
  PatternAnchor end;
  PatternAnchor start;
  PatternSelection *this_local;
  
  end.super_PatternCursorBase.column = (this->mStart).super_PatternCursorBase.row;
  end.super_PatternCursorBase.track = (this->mStart).super_PatternCursorBase.column;
  start.super_PatternCursorBase.row = (this->mStart).super_PatternCursorBase.track;
  local_28._0_4_ = (this->mEnd).super_PatternCursorBase.row;
  local_28._4_4_ = (this->mEnd).super_PatternCursorBase.column;
  end.super_PatternCursorBase.row = (this->mEnd).super_PatternCursorBase.track;
  start.super_PatternCursorBase._4_8_ = this;
  if ((int)(undefined4)local_28 < end.super_PatternCursorBase.column) {
    std::swap<int>(&end.super_PatternCursorBase.column,(int *)&local_28);
  }
  if (end.super_PatternCursorBase.row < start.super_PatternCursorBase.row) {
    std::swap<int>((int *)&start,(int *)&end);
    std::swap<int>(&end.super_PatternCursorBase.track,(int *)((long)&local_28 + 4));
  }
  else if (start.super_PatternCursorBase.row == end.super_PatternCursorBase.row) {
    if (local_28._4_4_ < end.super_PatternCursorBase.track) {
      std::swap<int>(&end.super_PatternCursorBase.track,(int *)((long)&local_28 + 4));
    }
  }
  start_00.super_PatternCursorBase.track = start.super_PatternCursorBase.row;
  start_00.super_PatternCursorBase.row = end.super_PatternCursorBase.column;
  start_00.super_PatternCursorBase.column = end.super_PatternCursorBase.track;
  end_00.super_PatternCursorBase.track = end.super_PatternCursorBase.row;
  end_00.super_PatternCursorBase.row = (undefined4)local_28;
  end_00.super_PatternCursorBase.column = local_28._4_4_;
  Iterator::Iterator(__return_storage_ptr__,start_00,end_00);
  return __return_storage_ptr__;
}

Assistant:

PatternSelection::Iterator PatternSelection::iterator() const {
    auto start = mStart;
    auto end = mEnd;

    // normalize coordinates

    if (start.row > end.row) {
        std::swap(start.row, end.row);
    }


    if (start.track > end.track) {
        std::swap(start.track, end.track);
        std::swap(start.column, end.column);
    } else if (start.track == end.track && start.column > end.column) {
        std::swap(start.column, end.column);
    }
    

    return {start, end};
}